

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::addsub<(moira::Core)0,(moira::Instr)4,4>(Moira *this,u32 op1,u32 op2)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)op2 + (ulong)op1;
  bVar3 = SUB81(uVar2 >> 0x20,0);
  (this->reg).sr.c = bVar3;
  (this->reg).sr.x = bVar3;
  bVar1 = (byte)(uVar2 >> 0x18);
  (this->reg).sr.v =
       (bool)((byte)(((byte)(op2 >> 0x18) ^ bVar1) & ((byte)(op1 >> 0x18) ^ bVar1)) >> 7);
  (this->reg).sr.z = (u32)uVar2 == 0;
  (this->reg).sr.n = (bool)((byte)(uVar2 >> 0x1f) & 1);
  return (u32)uVar2;
}

Assistant:

u32
Moira::addsub(u32 op1, u32 op2)
{
    u64 result;

    switch (I) {

        case Instr::ADD:
        case Instr::ADD_LOOP:
        case Instr::ADDI:
        case Instr::ADDQ:
        {
            result = U64_ADD(op1, op2);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::ADDX:
        case Instr::ADDX_LOOP:
        {
            result = U64_ADD3(op1, op2, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }
        case Instr::SUB:
        case Instr::SUB_LOOP:
        case Instr::SUBI:
        case Instr::SUBQ:
        {
            result = U64_SUB(op2, op1);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::SUBX:
        case Instr::SUBX_LOOP:
        {
            result = U64_SUB3(op2, op1, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);

    return (u32)result;
}